

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<double>::reserve(vec<double> *this,uint size)

{
  uint uVar1;
  double *pdVar2;
  
  uVar1 = this->cap;
  if (uVar1 < size) {
    if (uVar1 == 0) {
      uVar1 = 2;
      if (2 < size) {
        uVar1 = size;
      }
    }
    else {
      do {
        uVar1 = uVar1 * 3 + 1 >> 1;
      } while (uVar1 < size);
    }
    this->cap = uVar1;
    pdVar2 = (double *)realloc(this->data,(ulong)uVar1 << 3);
    this->data = pdVar2;
  }
  return;
}

Assistant:

void reserve(unsigned int size) {
		if (size > cap) {
			if (cap == 0) {
				cap = (size > 2) ? size : 2;
			} else {
				do {
					cap = (cap * 3 + 1) >> 1;
				} while (cap < size);
			}
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
	}